

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall CLI::Option::transform(Option *this,Validator *Validator,string *Validator_name)

{
  bool bVar1;
  reference validator_name;
  const_iterator in_RDI;
  value_type *in_stack_ffffffffffffff78;
  vector<CLI::Validator,_std::allocator<CLI::Validator>_> *in_stack_ffffffffffffff80;
  Validator *this_00;
  undefined8 in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::begin
            ((vector<CLI::Validator,_std::allocator<CLI::Validator>_> *)in_stack_ffffffffffffff78);
  __gnu_cxx::
  __normal_iterator<CLI::Validator_const*,std::vector<CLI::Validator,std::allocator<CLI::Validator>>>
  ::__normal_iterator<CLI::Validator*>
            ((__normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
              *)in_stack_ffffffffffffff80,
             (__normal_iterator<CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
              *)in_stack_ffffffffffffff78);
  std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::insert
            (in_stack_ffffffffffffff80,in_RDI,in_stack_ffffffffffffff78);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20503c);
  if (!bVar1) {
    validator_name =
         std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::front
                   (in_stack_ffffffffffffff80);
    this_00 = (Validator *)&stack0xffffffffffffffb0;
    ::std::__cxx11::string::string
              (in_stack_ffffffffffffffc0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffb8);
    CLI::Validator::name(this_00,(string *)validator_name);
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  }
  return (Option *)in_RDI._M_current;
}

Assistant:

CLI11_INLINE Option *Option::transform(Validator Validator, const std::string &Validator_name) {
    validators_.insert(validators_.begin(), std::move(Validator));
    if(!Validator_name.empty())
        validators_.front().name(Validator_name);
    return this;
}